

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::VRegistry::VRegistry(VRegistry *this,VerboseLevel level,EnumType *pFlags)

{
  EnumType *pFlags_local;
  VerboseLevel level_local;
  VRegistry *this_local;
  
  NoCopy::NoCopy((NoCopy *)this);
  threading::ThreadSafe::ThreadSafe(&this->super_ThreadSafe);
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00290180;
  *(VerboseLevel *)&(this->super_ThreadSafe).field_0xa = level;
  this->m_pFlags = pFlags;
  utils::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::map(&this->m_modules);
  return;
}

Assistant:

VRegistry::VRegistry(base::type::VerboseLevel level, base::type::EnumType* pFlags) : m_level(level), m_pFlags(pFlags) {
}